

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

FADFADSTATE * FADcos(FADFADSTATE *x)

{
  int iVar1;
  Fad<double> *pFVar2;
  Fad<Fad<double>_> *in_RSI;
  FADFADSTATE *in_RDI;
  int i;
  int sz;
  Fad<double> cosaval;
  Fad<double> sinaval;
  FADFADSTATE *cosa;
  int in_stack_fffffffffffffecc;
  Fad<Fad<double>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int iVar3;
  FADFADSTATE *this;
  Fad<double> *w;
  Fad<double> *in_stack_ffffffffffffff08;
  FadExpr<FadFuncCos<Fad<double>_>_> *in_stack_ffffffffffffff18;
  Fad<double> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  Fad<Fad<double>_> *in_stack_ffffffffffffff30;
  int local_bc;
  Fad<double> local_58 [2];
  
  this = in_RDI;
  Fad<Fad<double>_>::val(in_RSI);
  w = local_58;
  sin<double>(in_stack_ffffffffffffff08);
  Fad<double>::Fad<FadFuncSin<Fad<double>>>
            (in_stack_ffffffffffffff20,
             (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffff18);
  FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_fffffffffffffed0);
  pFVar2 = Fad<Fad<double>_>::val(in_RSI);
  cos<double>(in_stack_ffffffffffffff08);
  Fad<double>::Fad<FadFuncCos<Fad<double>>>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffed0);
  iVar1 = Fad<Fad<double>_>::size((Fad<Fad<double>_> *)0x1e4ccaf);
  iVar3 = iVar1;
  Fad<Fad<double>_>::Fad
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
  for (local_bc = 0; local_bc < iVar1; local_bc = local_bc + 1) {
    Fad<double>::operator-((Fad<double> *)CONCAT44(iVar3,in_stack_fffffffffffffed8));
    Fad<Fad<double>_>::dx(in_RSI,(int)((ulong)pFVar2 >> 0x20));
    operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffff08,w);
    in_stack_fffffffffffffed0 =
         (Fad<Fad<double>_> *)
         Fad<Fad<double>_>::fastAccessDx(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    Fad<double>::operator=
              ((Fad<double> *)this,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)in_RSI);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
               in_stack_fffffffffffffed0);
    Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffed0);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1e4cd7f);
  }
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffed0);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffed0);
  return in_RDI;
}

Assistant:

static FADFADSTATE FADcos(FADFADSTATE x)
{
    Fad<STATE> sinaval = sin(x.val());
    Fad<STATE> cosaval = cos(x.val());
    int sz = x.size();
    FADFADSTATE cosa(sz,cosaval);
    for (int i=0; i<sz; i++) {
        cosa.fastAccessDx(i) = -sinaval*x.dx(i);
    }
    return cosa;
}